

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinMemOutputStream.cpp
# Opt level: O1

void __thiscall
xercesc_4_0::BinMemOutputStream::BinMemOutputStream
          (BinMemOutputStream *this,XMLSize_t initCapacity,MemoryManager *manager)

{
  int iVar1;
  undefined4 extraout_var;
  
  BinOutputStream::BinOutputStream(&this->super_BinOutputStream);
  (this->super_BinOutputStream)._vptr_BinOutputStream =
       (_func_int **)&PTR__BinMemOutputStream_00414e70;
  this->fMemoryManager = manager;
  this->fDataBuf = (XMLByte *)0x0;
  this->fIndex = 0;
  this->fCapacity = initCapacity;
  iVar1 = (*manager->_vptr_MemoryManager[3])(manager,initCapacity + 4);
  this->fDataBuf = (XMLByte *)CONCAT44(extraout_var,iVar1);
  *(XMLByte *)CONCAT44(extraout_var,iVar1) = '\0';
  return;
}

Assistant:

BinMemOutputStream::BinMemOutputStream( XMLSize_t            initCapacity
                                      , MemoryManager* const manager)
: fMemoryManager(manager)
, fDataBuf(0)
, fIndex(0)
, fCapacity(initCapacity)
{
    // Buffer is one larger than capacity, to allow for zero term
    fDataBuf = (XMLByte*) fMemoryManager->allocate
    (
        (fCapacity + 4) * sizeof(XMLByte)
    );

    // Keep it null terminated
    fDataBuf[0] = XMLByte(0);
}